

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O0

ON_Curve * ON_TrimCurve(ON_Curve *curve,ON_Interval trim_parameters)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ON_PolyCurve *this;
  ON_Curve *c;
  undefined4 extraout_var_01;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ON_Curve *segment;
  ON_Interval sdom;
  int i;
  ON_PolyCurve *ptmp;
  ON_PolyCurve *polycurve;
  ON_Object *local_68;
  ON_Curve *right_crv;
  ON_Object *local_50;
  ON_Curve *left_crv;
  undefined1 auStack_40 [7];
  bool bDecreasing;
  ON_Interval curve_domain;
  ON_Curve *trimmed_curve;
  ON_Curve *curve_local;
  ON_Interval trim_parameters_local;
  
  dVar8 = trim_parameters.m_t[1];
  curve_local = trim_parameters.m_t[0];
  curve_domain.m_t[1] = 0.0;
  trim_parameters_local.m_t[0] = dVar8;
  (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  curve_domain.m_t[0] = dVar8;
  left_crv._7_1_ = ON_Interval::IsDecreasing((ON_Interval *)&curve_local);
  ON_Interval::Intersection((ON_Interval *)&curve_local,(ON_Interval *)auStack_40);
  if ((left_crv._7_1_ & 1) != 0) {
    ON_Interval::Swap((ON_Interval *)&curve_local);
    pdVar5 = ON_Interval::operator[]((ON_Interval *)&curve_local,0);
    dVar8 = *pdVar5;
    dVar7 = ON_Interval::operator[]((ON_Interval *)auStack_40,1);
    if ((dVar8 != dVar7) || (NAN(dVar8) || NAN(dVar7))) {
      pdVar5 = ON_Interval::operator[]((ON_Interval *)&curve_local,1);
      dVar8 = *pdVar5;
      dVar7 = ON_Interval::operator[]((ON_Interval *)auStack_40,0);
      if ((dVar8 != dVar7) || (NAN(dVar8) || NAN(dVar7))) {
        bVar1 = ON_Interval::IsDecreasing((ON_Interval *)&curve_local);
        if (!bVar1) {
          return (ON_Curve *)0x0;
        }
      }
      else {
        dVar8 = ON_Interval::operator[]((ON_Interval *)auStack_40,1);
        pdVar5 = ON_Interval::operator[]((ON_Interval *)&curve_local,1);
        *pdVar5 = dVar8;
      }
    }
    else {
      pdVar5 = ON_Interval::operator[]((ON_Interval *)&curve_local,1);
      dVar8 = *pdVar5;
      dVar7 = ON_Interval::operator[]((ON_Interval *)auStack_40,0);
      if ((dVar8 == dVar7) && (!NAN(dVar8) && !NAN(dVar7))) {
        return (ON_Curve *)0x0;
      }
      dVar8 = ON_Interval::operator[]((ON_Interval *)auStack_40,0);
      pdVar5 = ON_Interval::operator[]((ON_Interval *)&curve_local,0);
      *pdVar5 = dVar8;
    }
  }
  bVar1 = ON_Interval::IsDecreasing((ON_Interval *)&curve_local);
  if ((bVar1) &&
     (uVar2 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(),
     (uVar2 & 1) != 0)) {
    iVar4 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
    local_50 = (ON_Object *)CONCAT44(extraout_var,iVar4);
    pdVar5 = ON_Interval::operator[]((ON_Interval *)&curve_local,0);
    dVar8 = *pdVar5;
    dVar7 = ON_Interval::operator[]((ON_Interval *)auStack_40,1);
    ON_Interval::ON_Interval((ON_Interval *)&right_crv,dVar8,dVar7);
    iVar4 = (*((ON_Object *)CONCAT44(extraout_var,iVar4))->_vptr_ON_Object[0x3c])();
    if ((((byte)iVar4 ^ 0xff) & 1) != 0) {
      if (local_50 != (ON_Object *)0x0) {
        (*local_50->_vptr_ON_Object[4])();
      }
      return (ON_Curve *)0x0;
    }
    iVar4 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
    local_68 = (ON_Object *)CONCAT44(extraout_var_00,iVar4);
    dVar8 = ON_Interval::operator[]((ON_Interval *)auStack_40,0);
    pdVar5 = ON_Interval::operator[]((ON_Interval *)&curve_local,1);
    ON_Interval::ON_Interval((ON_Interval *)&polycurve,dVar8,*pdVar5);
    iVar4 = (*((ON_Object *)CONCAT44(extraout_var_00,iVar4))->_vptr_ON_Object[0x3c])();
    if ((((byte)iVar4 ^ 0xff) & 1) != 0) {
      if (local_50 != (ON_Object *)0x0) {
        (*local_50->_vptr_ON_Object[4])();
      }
      if (local_68 != (ON_Object *)0x0) {
        (*local_68->_vptr_ON_Object[4])();
      }
      return (ON_Curve *)0x0;
    }
    ptmp = ON_PolyCurve::Cast(local_50);
    if (ptmp == (ON_PolyCurve *)0x0) {
      ptmp = (ON_PolyCurve *)operator_new(0x40);
      ON_PolyCurve::ON_PolyCurve(ptmp);
      ON_PolyCurve::Append(ptmp,(ON_Curve *)local_50);
    }
    this = ON_PolyCurve::Cast(local_68);
    if (this == (ON_PolyCurve *)0x0) {
      ON_PolyCurve::Append(ptmp,(ON_Curve *)local_68);
    }
    else {
      for (sdom.m_t[1]._4_4_ = 0; iVar4 = sdom.m_t[1]._4_4_, iVar3 = ON_PolyCurve::Count(this),
          iVar4 < iVar3; sdom.m_t[1]._4_4_ = sdom.m_t[1]._4_4_ + 1) {
        _segment = ON_PolyCurve::SegmentDomain(this,sdom.m_t[1]._4_4_);
        c = ON_PolyCurve::HarvestSegment(this,sdom.m_t[1]._4_4_);
        pdVar5 = ON_Interval::operator[]((ON_Interval *)&segment,0);
        dVar8 = *pdVar5;
        pdVar5 = ON_Interval::operator[]((ON_Interval *)&segment,1);
        (*(c->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(dVar8,*pdVar5);
        ON_PolyCurve::Append(ptmp,c);
      }
      if (local_68 != (ON_Object *)0x0) {
        (*local_68->_vptr_ON_Object[4])();
      }
      local_68 = (ON_Object *)0x0;
    }
    pdVar5 = ON_Interval::operator[]((ON_Interval *)&curve_local,0);
    dVar8 = *pdVar5;
    pdVar5 = ON_Interval::operator[]((ON_Interval *)&curve_local,1);
    dVar7 = *pdVar5;
    dVar9 = ON_Interval::Length((ON_Interval *)auStack_40);
    (*(ptmp->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
              (dVar8,dVar7 + dVar9);
    curve_domain.m_t[1] = (double)ptmp;
  }
  else {
    bVar1 = ON_Interval::IsIncreasing((ON_Interval *)&curve_local);
    if (bVar1) {
      iVar4 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
      curve_domain.m_t[1] = (double)CONCAT44(extraout_var_01,iVar4);
      if (((long *)curve_domain.m_t[1] == (long *)0x0) ||
         (uVar6 = (**(code **)(*(long *)curve_domain.m_t[1] + 0x1e0))
                            (curve_domain.m_t[1],&curve_local), (uVar6 & 1) == 0)) {
        if (curve_domain.m_t[1] != 0.0) {
          (**(code **)(*(long *)curve_domain.m_t[1] + 0x20))();
        }
        curve_domain.m_t[1] = 0.0;
      }
    }
  }
  return (ON_Curve *)curve_domain.m_t[1];
}

Assistant:

ON_Curve* ON_TrimCurve( 
            const ON_Curve& curve,
            ON_Interval trim_parameters
            )
{
  ON_Curve* trimmed_curve = 0;

  const ON_Interval curve_domain = curve.Domain();
  bool bDecreasing = trim_parameters.IsDecreasing();
  trim_parameters.Intersection( curve_domain ); // trim_parameters will be increasing or empty
  if ( bDecreasing )
  {
    trim_parameters.Swap();
    if ( trim_parameters[0] == curve_domain[1] )
    {
      if ( trim_parameters[1] == curve_domain[0] )
        return 0;
      trim_parameters[0] = curve_domain[0];
    }
    else if ( trim_parameters[1] == curve_domain[0] )
      trim_parameters[1] = curve_domain[1];
    else if ( !trim_parameters.IsDecreasing() )
      return 0;
  }

  if ( trim_parameters.IsDecreasing() && curve.IsClosed() )
  {
    ON_Curve* left_crv = curve.DuplicateCurve();
    if ( !left_crv->Trim(ON_Interval(trim_parameters[0],curve_domain[1])) )
    {
      delete left_crv;
      return 0;
    }
    ON_Curve* right_crv = curve.DuplicateCurve();
    if ( !right_crv->Trim(ON_Interval(curve_domain[0],trim_parameters[1])) )
    {
      delete left_crv;
      delete right_crv;
      return 0;
    }
    ON_PolyCurve* polycurve = ON_PolyCurve::Cast(left_crv);
    if ( polycurve == nullptr )
    {
      polycurve = new ON_PolyCurve();      
      polycurve->Append( left_crv );
    }

    ON_PolyCurve* ptmp = ON_PolyCurve::Cast(right_crv);
    if ( ptmp )
    {
      int i;
      for ( i = 0; i < ptmp->Count(); i++ )
      {
        ON_Interval sdom = ptmp->SegmentDomain(i);
        ON_Curve* segment = ptmp->HarvestSegment(i);
        segment->SetDomain(sdom[0],sdom[1]); // to keep relative parameterization unchanged
        polycurve->Append( segment );
      }
      delete right_crv;
      ptmp = 0;
      right_crv = 0;
    }
    else
    {
      polycurve->Append( right_crv );
    }

    polycurve->SetDomain( trim_parameters[0], trim_parameters[1] + curve_domain.Length() );

    trimmed_curve = polycurve;
  }
  else if ( trim_parameters.IsIncreasing() )
  {
    trimmed_curve = curve.DuplicateCurve();
    if(!trimmed_curve || !trimmed_curve->Trim(trim_parameters) )
    {
      delete trimmed_curve;
      trimmed_curve = 0;
    }
  }

  return trimmed_curve;
}